

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID IVar4;
  uint *puVar5;
  uint in_EDI;
  ImGuiWindow *tooltip_window;
  ImGuiPayload *payload;
  bool is_hovered;
  ImGuiID source_parent_id;
  ImGuiID source_id;
  bool source_drag_active;
  ImGuiMouseButton mouse_button;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_ffffffffffffffbc;
  ImGuiMouseButton in_stack_ffffffffffffffc0;
  ImGuiWindow *in_stack_ffffffffffffffc8;
  ImGuiID in_stack_ffffffffffffffd4;
  ImGuiID IVar6;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar7;
  int iVar8;
  bool local_1;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  iVar8 = 0;
  uVar7 = (uint)in_stack_ffffffffffffffe0;
  IVar6 = 0;
  if ((in_EDI & 0x10) == 0) {
    IVar4 = (GImGui->LastItemData).ID;
    if (IVar4 == 0) {
      if ((((GImGui->IO).MouseDown[0] & 1U) == 0) || ((pIVar1->SkipItems & 1U) != 0)) {
        return false;
      }
      if ((((GImGui->LastItemData).StatusFlags & 1U) == 0) &&
         ((GImGui->ActiveId == 0 || (GImGui->ActiveIdWindow != pIVar1)))) {
        return false;
      }
      if ((in_EDI & 8) == 0) {
        return false;
      }
      IVar4 = ImGuiWindow::GetIDFromRectangle((ImGuiWindow *)(ulong)uVar7,(ImRect *)0x0);
      (pIVar2->LastItemData).ID = IVar4;
      bVar3 = ItemHoverable((ImRect *)CONCAT44(IVar4,IVar6),in_stack_ffffffffffffffd4);
      IVar6 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffd4);
      if ((bVar3) && (((pIVar2->IO).MouseClicked[iVar8] & 1U) != 0)) {
        SetActiveID(IVar6,in_stack_ffffffffffffffc8);
        FocusWindow((ImGuiWindow *)CONCAT44(iVar8,uVar7));
      }
      if (pIVar2->ActiveId == IVar4) {
        pIVar2->ActiveIdAllowOverlap = (bool)((byte)(IVar6 >> 0x18) & 1);
      }
    }
    else {
      if (GImGui->ActiveId != IVar4) {
        return false;
      }
      if (GImGui->ActiveIdMouseButton != -1) {
        iVar8 = GImGui->ActiveIdMouseButton;
      }
      if ((((GImGui->IO).MouseDown[iVar8] & 1U) == 0) || ((pIVar1->SkipItems & 1U) != 0)) {
        return false;
      }
      GImGui->ActiveIdAllowOverlap = false;
    }
    if (pIVar2->ActiveId != IVar4) {
      return false;
    }
    puVar5 = ImVector<unsigned_int>::back(&pIVar1->IDStack);
    IVar6 = *puVar5;
    bVar3 = IsMouseDragging(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    uVar7 = (uint)bVar3 << 0x18;
    SetActiveIdUsingNavAndKeys();
  }
  else {
    IVar4 = ImHashStr("#SourceExtern",0,0);
    uVar7 = 0x1000000;
  }
  if ((uVar7 & 0x1000000) == 0) {
    local_1 = false;
  }
  else {
    if ((pIVar2->DragDropActive & 1U) == 0) {
      ClearDragDrop();
      (pIVar2->DragDropPayload).SourceId = IVar4;
      (pIVar2->DragDropPayload).SourceParentId = IVar6;
      pIVar2->DragDropActive = true;
      pIVar2->DragDropSourceFlags = in_EDI;
      pIVar2->DragDropMouseButton = iVar8;
      if ((pIVar2->DragDropPayload).SourceId == pIVar2->ActiveId) {
        pIVar2->ActiveIdNoClearOnFocusLoss = true;
      }
    }
    pIVar2->DragDropSourceFrameCount = pIVar2->FrameCount;
    pIVar2->DragDropWithinSource = true;
    if ((((in_EDI & 1) == 0) && (BeginTooltip(), pIVar2->DragDropAcceptIdPrev != 0)) &&
       ((pIVar2->DragDropAcceptFlags & 0x1000U) != 0)) {
      pIVar1 = pIVar2->CurrentWindow;
      pIVar1->SkipItems = true;
      pIVar1->Hidden = true;
      pIVar1->HiddenFramesCanSkipItems = '\x01';
    }
    if (((in_EDI & 2) == 0) && ((in_EDI & 0x10) == 0)) {
      (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags & 0xfffffffe;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // FIXME-DRAGDROP: While in the common-most "drag from non-zero active id" case we can tell the mouse button,
    // in both SourceExtern and id==0 cases we may requires something else (explicit flags or some heuristic).
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = g.LastItemData.ID;
        if (source_id != 0)
        {
            // Common path: items with ID
            if (g.ActiveId != source_id)
                return false;
            if (g.ActiveIdMouseButton != -1)
                mouse_button = g.ActiveIdMouseButton;
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            g.ActiveIdAllowOverlap = false;
        }
        else
        {
            // Uncommon path: items without ID
            if (g.IO.MouseDown[mouse_button] == false || window->SkipItems)
                return false;
            if ((g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING/RESIZINGG OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            // Rely on keeping other window->LastItemXXX fields intact.
            source_id = g.LastItemData.ID = window->GetIDFromRectangle(g.LastItemData.Rect);
            bool is_hovered = ItemHoverable(g.LastItemData.Rect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging + cancel existing request if any
        SetActiveIdUsingNavAndKeys();
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
            if (payload.SourceId == g.ActiveId)
                g.ActiveIdNoClearOnFocusLoss = true;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->Hidden = tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            g.LastItemData.StatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}